

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O2

deFileResult mapReadWriteResult(deInt64 numBytes)

{
  int *piVar1;
  
  if (0 < numBytes) {
    return DE_FILERESULT_SUCCESS;
  }
  if (numBytes != 0) {
    piVar1 = __errno_location();
    return *piVar1 == 0xb ^ DE_FILERESULT_ERROR;
  }
  return DE_FILERESULT_END_OF_FILE;
}

Assistant:

static deFileResult mapReadWriteResult (deInt64 numBytes)
{
	if (numBytes > 0)
		return DE_FILERESULT_SUCCESS;
	else if (numBytes == 0)
		return DE_FILERESULT_END_OF_FILE;
	else
		return errno == EAGAIN ? DE_FILERESULT_WOULD_BLOCK : DE_FILERESULT_ERROR;
}